

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  u32 dst_offset;
  bool bVar2;
  RefVec *pRVar3;
  const_reference pvVar4;
  Table *dst_00;
  Table *src_00;
  allocator<char> local_a9;
  string local_a8;
  Ptr local_88;
  Enum local_70;
  u32 local_6c;
  uint local_68;
  uint dst;
  uint src;
  uint size;
  undefined1 local_58 [8];
  Ptr table_src;
  undefined1 local_38 [8];
  Ptr table_dst;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  table_dst.root_index_ = (Index)out_trap;
  pRVar3 = Instance::tables(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32);
  table_src.root_index_ = pvVar4->index;
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_38,pSVar1,(Ref)table_src.root_index_);
  pSVar1 = this->store_;
  pRVar3 = Instance::tables(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (pRVar3,(ulong)instr.field_2.imm_u32x2.snd);
  _src = pvVar4->index;
  RefPtr<wabt::interp::Table>::RefPtr((RefPtr<wabt::interp::Table> *)local_58,pSVar1,_src);
  dst = Pop<unsigned_int>(this);
  local_68 = Pop<unsigned_int>(this);
  local_6c = Pop<unsigned_int>(this);
  pSVar1 = this->store_;
  dst_00 = RefPtr<wabt::interp::Table>::operator*((RefPtr<wabt::interp::Table> *)local_38);
  dst_offset = local_6c;
  src_00 = RefPtr<wabt::interp::Table>::operator*((RefPtr<wabt::interp::Table> *)local_58);
  local_70 = (Enum)Table::Copy(pSVar1,dst_00,dst_offset,src_00,local_68,dst);
  bVar2 = Failed((Result)local_70);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"out of bounds table access: table.copy out of bounds",&local_a9)
    ;
    Trap::New(&local_88,pSVar1,&local_a8,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)table_dst.root_index_,&local_88);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_58);
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoTableCopy(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table_dst{store_, inst_->tables()[instr.imm_u32x2.fst]};
  Table::Ptr table_src{store_, inst_->tables()[instr.imm_u32x2.snd]};
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(Table::Copy(store_, *table_dst, dst, *table_src, src, size)),
          "out of bounds table access: table.copy out of bounds");
  return RunResult::Ok;
}